

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_p_race(void)

{
  player_race *ppVar1;
  player_race_list *ppVar2;
  player_race_list *p;
  player_race *p_00;
  player_race_list *old;
  
  p_00 = races;
  if (races != (player_race *)0x0) {
    do {
      ppVar1 = p_00->next;
      p = p_00->dislikes;
      while (p != (player_race_list *)0x0) {
        string_free(p->name);
        ppVar2 = p->next;
        mem_free(p);
        p = ppVar2;
      }
      string_free(p_00->name);
      string_free(p_00->hometown);
      mem_free(p_00);
      p_00 = ppVar1;
    } while (ppVar1 != (player_race *)0x0);
  }
  return;
}

Assistant:

static void cleanup_p_race(void)
{
	struct player_race *p = races;
	struct player_race *next;

	while (p) {
		struct player_race_list *list = p->dislikes;
		next = p->next;
		while (list) {
			struct player_race_list *old = list;
			string_free((char *)list->name);
			list = list->next;
			mem_free(old);
		}
		string_free((char *)p->name);
		string_free(p->hometown);
		mem_free(p);
		p = next;
	}
}